

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O0

bool __thiscall xmrig::CudaBackend::isEnabled(CudaBackend *this,Algorithm *algorithm)

{
  bool bVar1;
  Config *this_00;
  CudaConfig *this_01;
  long in_RDI;
  Threads<xmrig::CudaThreads> *in_stack_00000020;
  
  this_00 = Base::config((Base *)**(undefined8 **)(in_RDI + 8));
  this_01 = Config::cuda(this_00);
  CudaConfig::threads(this_01);
  Threads<xmrig::CudaThreads>::get(in_stack_00000020);
  bVar1 = CudaThreads::isEmpty((CudaThreads *)0x22303f);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool xmrig::CudaBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cuda().threads().get().isEmpty();
}